

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateGLImpl::
DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
::RESOURCE_DIMENSION_bool_
          (void *this,GLResourceAttribs *Attribs,RESOURCE_DIMENSION ResDim,bool IsMS)

{
  ShaderResourceCacheGL *ResourceCache;
  int iVar1;
  undefined8 *puVar2;
  uint ResIndex;
  bool bVar3;
  string msg;
  
  puVar2 = *(undefined8 **)((long)this + 0x10);
  if ((ulong)*(uint *)(puVar2 + 1) != 0xffffffff) {
    ResIndex = *(uint *)((long)puVar2 + 0xc);
    iVar1 = *(int *)(puVar2 + 2);
    bVar3 = true;
    if (ResIndex == 0xffffffff) {
      if (iVar1 == -1) goto LAB_002d84b9;
      iVar1 = *(int *)(puVar2 + 2);
      bVar3 = iVar1 != -1;
    }
    if (!(bool)(bVar3 & iVar1 != -1)) {
      ResourceCache =
           *(ShaderResourceCacheGL **)(*(long *)((long)this + 8) + (ulong)*(uint *)(puVar2 + 1) * 8)
      ;
      if (ResourceCache == (ShaderResourceCacheGL *)0x0) {
        FormatString<char[25],unsigned_int,char[10]>
                  (&msg,(Diligent *)"Resource cache at index ",(char (*) [25])(puVar2 + 1),
                   (uint *)0x90762e,(char (*) [10])(ulong)ResIndex);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Validate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x303);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        puVar2 = *(undefined8 **)((long)this + 0x10);
        ResIndex = *(Uint32 *)((long)puVar2 + 0xc);
      }
      PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
                ((PipelineResourceSignatureGLImpl *)*puVar2,Attribs,ResDim,IsMS,ResIndex,
                 ResourceCache,
                 *(char **)(*(long *)(*this + 0xf8) + (ulong)**(uint **)((long)this + 0x18) * 0x20),
                 *(char **)(*this + 0x18));
      puVar2 = *(undefined8 **)((long)this + 0x10);
    }
  }
LAB_002d84b9:
  *(undefined8 **)((long)this + 0x10) = puVar2 + 3;
  return;
}

Assistant:

void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }